

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

string * pbrt::FindMatchingNamedSpectrum_abi_cxx11_(SpectrumHandle *s)

{
  bool bVar1;
  reference ppVar2;
  SpectrumHandle *in_RSI;
  string *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>
  *spd;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
  *__range1;
  anon_class_1_0_00000001 sampledLambdasMatch;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
  *in_stack_ffffffffffffff78;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>
  *in_stack_ffffffffffffff80;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  _Self local_30;
  _Self local_28;
  undefined1 *local_20;
  SpectrumHandle *in_stack_ffffffffffffffe8;
  string *this;
  
  local_20 = Spectra::(anonymous_namespace)::namedSpectra_abi_cxx11_;
  this = in_RDI;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
       ::begin(in_stack_ffffffffffffff78);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
       ::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
      return in_RDI;
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>
                          *)0x8f7993);
    SpectrumHandle::SpectrumHandle
              ((SpectrumHandle *)in_stack_ffffffffffffff80,
               (SpectrumHandle *)in_stack_ffffffffffffff78);
    SpectrumHandle::SpectrumHandle
              ((SpectrumHandle *)in_stack_ffffffffffffff80,
               (SpectrumHandle *)in_stack_ffffffffffffff78);
    bVar1 = FindMatchingNamedSpectrum::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)this,in_RSI,in_stack_ffffffffffffffe8);
    if (bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>
    ::operator++(in_stack_ffffffffffffff80);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)ppVar2);
  return in_RDI;
}

Assistant:

std::string FindMatchingNamedSpectrum(SpectrumHandle s) {
    auto sampledLambdasMatch = [](SpectrumHandle a, SpectrumHandle b) {
        const Float wls[] = {306, 360.932007, 380, 402, 455, 503, 579,
                             610, 660,        692, 702, 760, 800, 860};
        for (Float lambda : wls)
            if (a(lambda) != b(lambda))
                return false;
        return true;
    };
    for (const auto &spd : Spectra::namedSpectra) {
        if (sampledLambdasMatch(s, spd.second))
            return spd.first;
    }
    return "";
}